

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEnd)

{
  int iVar1;
  XMLElement *this_00;
  char *p_00;
  char *q;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  bool mismatch;
  XMLElement *ele;
  XMLDeclaration *decl;
  StrPair endTag;
  XMLNode *node;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  XMLDocument *in_stack_ffffffffffffff10;
  XMLNode *in_stack_ffffffffffffff18;
  XMLDocument *in_stack_ffffffffffffff50;
  XMLNode **in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  XMLDocument *in_stack_ffffffffffffff68;
  int local_50;
  StrPair local_40;
  long *local_28;
  long local_20;
  char *local_18;
  char *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  do {
    bVar2 = false;
    if (local_18 != (char *)0x0) {
      bVar2 = *local_18 != '\0';
    }
    if (!bVar2) goto LAB_00257ece;
    local_28 = (long *)0x0;
    local_18 = XMLDocument::Identify
                         (in_stack_ffffffffffffff68,
                          (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
    if (local_28 == (long *)0x0) goto LAB_00257ece;
    StrPair::StrPair(&local_40);
    local_18 = (char *)(**(code **)(*local_28 + 0x88))(local_28,local_18,&local_40);
    if (local_18 == (char *)0x0) {
      DeleteNode(&in_stack_ffffffffffffff10->super_XMLNode);
      bVar2 = XMLDocument::Error(*(XMLDocument **)(in_RDI + 8));
      if (!bVar2) {
        XMLDocument::SetError
                  (*(XMLDocument **)(in_RDI + 8),XML_ERROR_PARSING,(char *)0x0,(char *)0x0);
      }
      local_50 = 3;
    }
    else {
      in_stack_ffffffffffffff68 = (XMLDocument *)(**(code **)(*local_28 + 0x20))();
      if ((in_stack_ffffffffffffff68 == (XMLDocument *)0x0) ||
         (in_stack_ffffffffffffff67 = NoChildren(*(XMLNode **)(in_RDI + 8)),
         (bool)in_stack_ffffffffffffff67)) {
        this_00 = (XMLElement *)(**(code **)*local_28)();
        if (this_00 == (XMLElement *)0x0) {
LAB_00257e7c:
          InsertEndChild(in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->super_XMLNode);
          local_50 = 0;
        }
        else {
          iVar1 = XMLElement::ClosingType(this_00);
          if (iVar1 == 2) {
            if (local_20 != 0) {
              StrPair::TransferTo((StrPair *)in_stack_ffffffffffffff10,
                                  (StrPair *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            }
            (**(code **)(*(long *)local_28[10] + 0x28))();
            DeleteNode(&in_stack_ffffffffffffff10->super_XMLNode);
            local_8 = local_18;
            local_50 = 1;
          }
          else {
            bVar2 = StrPair::Empty(&local_40);
            if (bVar2) {
              iVar1 = XMLElement::ClosingType(this_00);
              bVar2 = iVar1 == 0;
            }
            else {
              iVar1 = XMLElement::ClosingType(this_00);
              if (iVar1 == 0) {
                p_00 = StrPair::GetStr((StrPair *)in_stack_ffffffffffffff50);
                q = XMLElement::Name((XMLElement *)0x257dde);
                bVar2 = XMLUtil::StringEqual(p_00,q,0x7fffffff);
                bVar2 = !bVar2;
              }
              else {
                bVar2 = true;
              }
            }
            if (!bVar2) goto LAB_00257e7c;
            in_stack_ffffffffffffff10 = *(XMLDocument **)(in_RDI + 8);
            in_stack_ffffffffffffff18 = (XMLNode *)XMLElement::Name((XMLElement *)0x257e3d);
            XMLDocument::SetError
                      (in_stack_ffffffffffffff10,XML_ERROR_MISMATCHED_ELEMENT,
                       (char *)in_stack_ffffffffffffff18,(char *)0x0);
            DeleteNode(&in_stack_ffffffffffffff10->super_XMLNode);
            local_50 = 3;
          }
        }
      }
      else {
        in_stack_ffffffffffffff50 = *(XMLDocument **)(in_RDI + 8);
        in_stack_ffffffffffffff58 =
             (XMLNode **)
             Value((XMLNode *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        XMLDocument::SetError
                  (in_stack_ffffffffffffff50,XML_ERROR_PARSING_DECLARATION,
                   (char *)in_stack_ffffffffffffff58,(char *)0x0);
        DeleteNode(&in_stack_ffffffffffffff10->super_XMLNode);
        local_50 = 3;
      }
    }
    StrPair::~StrPair((StrPair *)0x257eab);
    if (local_50 != 0) {
      if (local_50 != 1) {
LAB_00257ece:
        local_8 = (char *)0x0;
      }
      return local_8;
    }
    in_stack_ffffffffffffff0c = 0;
  } while( true );
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEnd )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

    while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        if ( node == 0 ) {
            break;
        }

        StrPair endTag;
        p = node->ParseDeep( p, &endTag );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, 0, 0 );
            }
            break;
        }

        XMLDeclaration* decl = node->ToDeclaration();
        if ( decl ) {
                // A declaration can only be the first child of a document.
                // Set error, if document already has children.
                if ( !_document->NoChildren() ) {
                        _document->SetError( XML_ERROR_PARSING_DECLARATION, decl->Value(), 0);
                        DeleteNode( decl );
                        break;
                }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEnd ) {
                    ele->_value.TransferTo( parentEnd );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, ele->Name(), 0 );
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}